

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
llvm::ItaniumPartialDemangler::ItaniumPartialDemangler(ItaniumPartialDemangler *this)

{
  undefined8 *puVar1;
  
  this->RootNode = (void *)0x0;
  puVar1 = (undefined8 *)operator_new(0x1300);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = puVar1 + 5;
  puVar1[3] = puVar1 + 5;
  puVar1[4] = puVar1 + 0x25;
  puVar1[0x25] = puVar1 + 0x28;
  puVar1[0x26] = puVar1 + 0x28;
  puVar1[0x27] = puVar1 + 0x48;
  puVar1[0x48] = puVar1 + 0x4b;
  puVar1[0x49] = puVar1 + 0x4b;
  puVar1[0x4a] = puVar1 + 0x53;
  puVar1[0x53] = puVar1 + 0x56;
  puVar1[0x54] = puVar1 + 0x56;
  puVar1[0x55] = puVar1 + 0x5a;
  puVar1[0x5a] = 0;
  puVar1[0x5b] = 0;
  *(undefined2 *)(puVar1 + 0x5c) = 1;
  *(undefined1 *)((long)puVar1 + 0x2e2) = 0;
  puVar1[0x5e] = 0;
  puVar1[0x5f] = 0;
  puVar1[0x25e] = puVar1 + 0x5e;
  this->Context = puVar1;
  return;
}

Assistant:

ItaniumPartialDemangler::ItaniumPartialDemangler()
    : RootNode(nullptr), Context(new Db{nullptr, nullptr}) {}